

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandPlayerType::Tick
          (CommandPlayerType *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  uint uVar1;
  SBarInfoCommand **ppSVar2;
  long *plVar3;
  PClassPlayerPawn *pPVar4;
  PClass **ppPVar5;
  uint uVar6;
  PClassPlayerPawn *pPVar7;
  PClassPlayerPawn *pPVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  
  bVar11 = (this->super_SBarInfoCommandFlowControl).truth;
  uVar9 = (ulong)(this->super_SBarInfoCommandFlowControl).commands[bVar11].
                 super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count;
  if (uVar9 != 0) {
    ppSVar2 = (this->super_SBarInfoCommandFlowControl).commands[bVar11].
              super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
    lVar10 = 0;
    do {
      plVar3 = *(long **)((long)ppSVar2 + lVar10);
      (**(code **)(*plVar3 + 0x28))(plVar3,block,statusBar,hudChanged);
      lVar10 = lVar10 + 8;
    } while (uVar9 << 3 != lVar10);
  }
  pPVar4 = ((statusBar->super_DBaseStatusBar).CPlayer)->cls;
  if (pPVar4 != (PClassPlayerPawn *)0x0) {
    uVar1 = (this->classes).Count;
    bVar11 = uVar1 != 0;
    if (bVar11) {
      ppPVar5 = (this->classes).Array;
      pPVar7 = (PClassPlayerPawn *)*ppPVar5;
      if (pPVar4 != pPVar7) {
        uVar6 = 0;
        pPVar8 = pPVar4;
LAB_00600679:
        do {
          pPVar8 = (PClassPlayerPawn *)(pPVar8->super_PClassActor).super_PClass.ParentClass;
          if (pPVar8 != pPVar7) {
            if (pPVar8 != (PClassPlayerPawn *)0x0) goto LAB_00600679;
          }
          if (pPVar8 != (PClassPlayerPawn *)0x0) break;
          uVar6 = uVar6 + 1;
          bVar11 = uVar6 < uVar1;
          if (uVar6 == uVar1) goto LAB_006006c9;
          pPVar7 = (PClassPlayerPawn *)ppPVar5[uVar6];
          pPVar8 = pPVar4;
        } while (pPVar4 != pPVar7);
      }
      if (((this->super_SBarInfoCommandFlowControl).truth == false) &&
         ((this->super_SBarInfoCommandFlowControl).truth = true, block != (SBarInfoMainBlock *)0x0))
      {
        (*(this->super_SBarInfoCommandFlowControl).super_SBarInfoCommand._vptr_SBarInfoCommand[5])
                  (this,block,statusBar,1);
      }
    }
LAB_006006c9:
    if (((!bVar11) && ((this->super_SBarInfoCommandFlowControl).truth != false)) &&
       ((this->super_SBarInfoCommandFlowControl).truth = false, block != (SBarInfoMainBlock *)0x0))
    {
      (*(this->super_SBarInfoCommandFlowControl).super_SBarInfoCommand._vptr_SBarInfoCommand[5])
                (this,block,statusBar,1);
      return;
    }
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoCommandFlowControl::Tick(block, statusBar, hudChanged);

			if(statusBar->CPlayer->cls == NULL)
				return; //No class so we can not continue
		
			for(unsigned int i = 0;i < classes.Size();i++)
			{
				if (statusBar->CPlayer->cls->IsDescendantOf(classes[i]))
				{
					SetTruth(true, block, statusBar);
					return;
				}
			}
			SetTruth(false, block, statusBar);
		}